

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O1

void __thiscall Fl_Widget::Fl_Widget(Fl_Widget *this,int X,int Y,int W,int H,char *L)

{
  Fl_Group *pFVar1;
  
  this->_vptr_Fl_Widget = (_func_int **)&PTR__Fl_Widget_00279f70;
  this->x_ = X;
  this->y_ = Y;
  this->w_ = W;
  this->h_ = H;
  (this->label_).value = L;
  (this->label_).type = '\0';
  (this->label_).image = (Fl_Image *)0x0;
  (this->label_).deimage = (Fl_Image *)0x0;
  (this->label_).font = 0;
  (this->label_).size = FL_NORMAL_SIZE;
  (this->label_).color = 0;
  (this->label_).align_ = 0;
  this->tooltip_ = (char *)0x0;
  this->callback_ = default_callback;
  this->user_data_ = (void *)0x0;
  this->type_ = '\0';
  this->flags_ = 0x200;
  this->damage_ = '\0';
  this->box_ = '\0';
  this->color_ = 0x31;
  this->color2_ = 0x31;
  this->when_ = '\x04';
  this->parent_ = (Fl_Group *)0x0;
  pFVar1 = Fl_Group::current();
  if (pFVar1 != (Fl_Group *)0x0) {
    pFVar1 = Fl_Group::current();
    Fl_Group::add(pFVar1,this);
  }
  if (fl_graphics_driver != (Fl_Graphics_Driver *)0x0) {
    return;
  }
  Fl_Display_Device::display_device();
  return;
}

Assistant:

Fl_Widget::Fl_Widget(int X, int Y, int W, int H, const char* L) {

  x_ = X; y_ = Y; w_ = W; h_ = H;

  label_.value	 = L;
  label_.image   = 0;
  label_.deimage = 0;
  label_.type	 = FL_NORMAL_LABEL;
  label_.font	 = FL_HELVETICA;
  label_.size	 = FL_NORMAL_SIZE;
  label_.color	 = FL_FOREGROUND_COLOR;
  label_.align_	 = FL_ALIGN_CENTER;
  tooltip_       = 0;
  callback_	 = default_callback;
  user_data_ 	 = 0;
  type_		 = 0;
  flags_	 = VISIBLE_FOCUS;
  damage_	 = 0;
  box_		 = FL_NO_BOX;
  color_	 = FL_GRAY;
  color2_	 = FL_GRAY;
  when_		 = FL_WHEN_RELEASE;

  parent_ = 0;
  if (Fl_Group::current()) Fl_Group::current()->add(this);
  if (!fl_graphics_driver) {
    // Make sure fl_graphics_driver is initialized. Important if we are called by a static initializer.
    Fl_Display_Device::display_device();
  }
}